

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::write_float<char,fmt::v10::appender,float>
                   (appender out,float value,format_specs<char> specs,locale_ref loc)

{
  int iVar1;
  float_specs fVar2;
  long lVar3;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  int precision;
  ulong uVar8;
  appender out_00;
  float_specs *in_R9;
  appender it;
  bool bVar9;
  undefined4 in_XMM0_Db;
  ulong uVar10;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  ulong uVar11;
  format_specs<char> specs_00;
  float_specs fspecs;
  big_decimal_fp f;
  memory_buffer buffer;
  float_specs local_280;
  format_specs<char> local_278;
  undefined8 local_268;
  undefined8 uStack_260;
  big_decimal_fp local_250;
  buffer<char> local_240;
  char local_220 [504];
  
  local_278._8_8_ = specs._8_8_;
  local_278._0_8_ = specs._0_8_;
  local_268 = CONCAT44(in_XMM0_Db,value);
  uStack_260 = CONCAT44(in_XMM0_Dd,in_XMM0_Dc);
  fVar2 = parse_float_type_spec<fmt::v10::detail::error_handler,char>
                    (&local_278,(error_handler *)&local_240);
  uVar6 = fVar2._4_4_ & 0xffff00ff;
  uVar7 = uVar6 + ((ushort)local_278._9_2_ & 0x70) * 0x10;
  local_280.precision = fVar2.precision;
  local_280._4_4_ = uVar7;
  if ((int)local_268 < 0) {
    uVar7 = uVar6 | 0x100;
    local_280 = (float_specs)((ulong)fVar2 & 0xffff00ffffffffff | 0x10000000000);
    uVar10 = local_268 ^ 0x8000000080000000;
    uVar11 = uStack_260 ^ 0x8000000080000000;
  }
  else {
    uVar10 = local_268;
    uVar11 = uStack_260;
    if (((ushort)local_278._9_2_ & 0x70) == 0x10) {
      local_280 = (float_specs)((ulong)fVar2 & 0xffff00ffffffffff);
      uVar7 = uVar6;
    }
  }
  if ((float)uVar10 == INFINITY) {
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._1_7_ = 0;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_1_ =
         NAN((float)uVar10);
    specs_00._8_8_ = &local_280;
    specs_00._0_8_ = local_278._8_8_;
    bVar4.container =
         (buffer<char> *)
         write_nonfinite<char,fmt::v10::appender>
                   (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,out_00
                    ,local_278.width._0_1_,specs_00,in_R9);
  }
  else {
    uVar6 = uVar7;
    if (((local_278._9_2_ & 0xf) == 4) && ((uVar7 & 0xff00) != 0)) {
      cVar5 = ""[uVar7 >> 8 & 0xff];
      lVar3 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      uVar8 = lVar3 + 1;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) < uVar8) {
        local_268 = uVar10;
        uStack_260 = uVar11;
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        lVar3 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        uVar8 = lVar3 + 1;
        uVar10 = local_268;
      }
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar8;
      *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 8) + lVar3) = cVar5;
      uVar6 = uVar7 & 0xffff00ff;
      local_280 = (float_specs)(CONCAT44(uVar7,local_280.precision) & 0xffff00ffffffffff);
      if (local_278.width != 0) {
        local_278.width = local_278.width + -1;
      }
    }
    local_240.size_ = 0;
    local_240._vptr_buffer = (_func_int **)&PTR_grow_0025b7f8;
    local_240.capacity_ = 500;
    cVar5 = (char)uVar6;
    local_240.ptr_ = local_220;
    if (cVar5 == '\x03') {
      bVar9 = (uVar6 & 0xff00) != 0;
      if (bVar9) {
        local_220[0] = ""[uVar6 >> 8 & 0xff];
      }
      local_240.size_ = (size_t)bVar9;
      format_hexfloat<double,_0>((double)(float)uVar10,local_278.precision,local_280,&local_240);
      local_250.significand = local_240.ptr_;
      local_250.significand_size = (undefined4)local_240.size_;
      local_250.exponent = local_240.size_._4_4_;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_bytes<(fmt::v10::align::type)2,char,fmt::v10::appender>(fmt::v10::appender,fmt::v10::basic_string_view<char>,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                     (out,&local_278,local_240.size_,local_240.size_,
                      (anon_class_16_1_a7b7af8b *)&local_250);
    }
    else {
      precision = 6;
      if (local_278.type == none) {
        precision = local_278.precision;
      }
      if (-1 < (long)local_278._0_8_) {
        precision = local_278.precision;
      }
      if (cVar5 == '\x01') {
        if (precision == 0x7fffffff) {
          throw_format_error("number is too big");
        }
        precision = precision + 1;
      }
      else {
        iVar1 = 1;
        if (precision != 0) {
          iVar1 = precision;
        }
        if (cVar5 != '\x02') {
          precision = iVar1;
        }
      }
      local_280 = (float_specs)(CONCAT44(uVar6,local_280.precision) | 0x4000000000000);
      iVar1 = format_float<double>((double)(float)uVar10,precision,local_280,&local_240);
      local_280.precision = precision;
      local_250.significand = local_240.ptr_;
      local_250._8_8_ = CONCAT44(iVar1,(int)local_240.size_);
      bVar4.container =
           (buffer<char> *)
           do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                     (out,&local_250,&local_278,local_280,loc);
    }
    if (local_240.ptr_ != local_220) {
      operator_delete(local_240.ptr_,local_240.capacity_);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value,
                                 format_specs<Char> specs, locale_ref loc)
    -> OutputIt {
  float_specs fspecs = parse_float_type_spec(specs);
  fspecs.sign = specs.sign;
  if (detail::signbit(value)) {  // value < 0 is false for NaN so use signbit.
    fspecs.sign = sign::minus;
    value = -value;
  } else if (fspecs.sign == sign::minus) {
    fspecs.sign = sign::none;
  }

  if (!detail::isfinite(value))
    return write_nonfinite(out, detail::isnan(value), specs, fspecs);

  if (specs.align == align::numeric && fspecs.sign) {
    auto it = reserve(out, 1);
    *it++ = detail::sign<Char>(fspecs.sign);
    out = base_iterator(out, it);
    fspecs.sign = sign::none;
    if (specs.width != 0) --specs.width;
  }

  memory_buffer buffer;
  if (fspecs.format == float_format::hex) {
    if (fspecs.sign) buffer.push_back(detail::sign<char>(fspecs.sign));
    format_hexfloat(convert_float(value), specs.precision, fspecs, buffer);
    return write_bytes<align::right>(out, {buffer.data(), buffer.size()},
                                     specs);
  }
  int precision = specs.precision >= 0 || specs.type == presentation_type::none
                      ? specs.precision
                      : 6;
  if (fspecs.format == float_format::exp) {
    if (precision == max_value<int>())
      throw_format_error("number is too big");
    else
      ++precision;
  } else if (fspecs.format != float_format::fixed && precision == 0) {
    precision = 1;
  }
  if (const_check(std::is_same<T, float>())) fspecs.binary32 = true;
  int exp = format_float(convert_float(value), precision, fspecs, buffer);
  fspecs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float(out, f, specs, fspecs, loc);
}